

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void __thiscall QGesture::QGesture(QGesture *this,QObject *parent)

{
  QGesturePrivate *pQVar1;
  QObject *in_RSI;
  QObject *in_RDI;
  
  pQVar1 = (QGesturePrivate *)operator_new(0xa8);
  QGesturePrivate::QGesturePrivate(pQVar1);
  QObject::QObject(in_RDI,&pQVar1->super_QObjectPrivate,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d06c20;
  pQVar1 = d_func((QGesture *)0x2fb0bf);
  pQVar1->gestureType = CustomGesture;
  return;
}

Assistant:

QGesture::QGesture(QObject *parent)
    : QObject(*new QGesturePrivate, parent)
{
    d_func()->gestureType = Qt::CustomGesture;
}